

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_stepper.cpp
# Opt level: O0

void QtMWidgets::Stepper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  QColor *pQVar5;
  void *_v_1;
  Stepper *_t_2;
  void *_v;
  Stepper *_t_1;
  int *result;
  Stepper *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      valueChanged((Stepper *)_o,*_a[1]);
      break;
    case 1:
      setValue((Stepper *)_o,*_a[1]);
      break;
    case 2:
      stepDown((Stepper *)_o);
      break;
    case 3:
      stepUp((Stepper *)_o);
      break;
    case 4:
      _q_autorepeat((Stepper *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == valueChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      iVar4 = maximum((Stepper *)_o);
      *piVar2 = iVar4;
      break;
    case 1:
      iVar4 = minimum((Stepper *)_o);
      *piVar2 = iVar4;
      break;
    case 2:
      iVar4 = singleStep((Stepper *)_o);
      *piVar2 = iVar4;
      break;
    case 3:
      iVar4 = value((Stepper *)_o);
      *piVar2 = iVar4;
      break;
    case 4:
      bVar3 = wrapping((Stepper *)_o);
      *(bool *)piVar2 = bVar3;
      break;
    case 5:
      bVar3 = autorepeat((Stepper *)_o);
      *(bool *)piVar2 = bVar3;
      break;
    case 6:
      pQVar5 = color((Stepper *)_o);
      *(undefined8 *)piVar2 = *(undefined8 *)pQVar5;
      piVar2[2] = *(int *)((long)&pQVar5->ct + 4);
      *(ushort *)(piVar2 + 3) = (pQVar5->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    pQVar5 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setMaximum((Stepper *)_o,pQVar5->cspec);
      break;
    case 1:
      setMinimum((Stepper *)_o,pQVar5->cspec);
      break;
    case 2:
      setSingleStep((Stepper *)_o,pQVar5->cspec);
      break;
    case 3:
      setValue((Stepper *)_o,pQVar5->cspec);
      break;
    case 4:
      setWrapping((Stepper *)_o,(bool)((char)pQVar5->cspec & Rgb));
      break;
    case 5:
      setAutorepeat((Stepper *)_o,(bool)((char)pQVar5->cspec & Rgb));
      break;
    case 6:
      setColor((Stepper *)_o,pQVar5);
    }
  }
  return;
}

Assistant:

void QtMWidgets::Stepper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->stepDown(); break;
        case 3: _t->stepUp(); break;
        case 4: _t->_q_autorepeat(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Stepper::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Stepper::valueChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->maximum(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->singleStep(); break;
        case 3: *reinterpret_cast< int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->wrapping(); break;
        case 5: *reinterpret_cast< bool*>(_v) = _t->autorepeat(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMaximum(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setMinimum(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setSingleStep(*reinterpret_cast< int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast< int*>(_v)); break;
        case 4: _t->setWrapping(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setAutorepeat(*reinterpret_cast< bool*>(_v)); break;
        case 6: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}